

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::addInputArgumentConversions
          (HlslParseContext *this,TFunction *function,TIntermTyped **arguments)

{
  TType *pTVar1;
  TIntermediate *pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  EShLanguage s;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TQualifier *pTVar7;
  undefined4 extraout_var_01;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  reference ppTVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar9;
  undefined4 extraout_var_11;
  TVariable *pTVar10;
  undefined4 extraout_var_12;
  TIntermSymbol *this_01;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TIntermTyped *pTVar11;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TIntermAggregate *arg_00;
  undefined4 extraout_var_20;
  char *s_00;
  TIntermTyped *local_90;
  TIntermTyped *local_88;
  TIntermAggregate *assignAgg;
  TIntermSymbol *internalSymbolNode;
  TVariable *internalAggregate;
  TIntermTyped *convArg;
  TIntermTyped *arg;
  undefined1 auStack_40 [4];
  int param;
  anon_class_24_3_eb5deb76 setArg;
  TIntermAggregate *aggregate;
  TIntermTyped **arguments_local;
  TFunction *function_local;
  HlslParseContext *this_local;
  
  iVar4 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[6])();
  setArg.aggregate = (TIntermAggregate **)CONCAT44(extraout_var,iVar4);
  setArg.arguments = (TIntermTyped **)&setArg.aggregate;
  _auStack_40 = function;
  setArg.function = (TFunction *)arguments;
  for (arg._4_4_ = 0; iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(),
      (int)arg._4_4_ < iVar4; arg._4_4_ = arg._4_4_ + 1) {
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
    pTVar7 = (TQualifier *)(**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar4) + 8) + 0x50))();
    bVar3 = TQualifier::isParamInput(pTVar7);
    if (bVar3) {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
      if (iVar4 == 1) {
        iVar4 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[3])();
        local_88 = (TIntermTyped *)CONCAT44(extraout_var_01,iVar4);
      }
      else {
        if (setArg.aggregate == (TIntermAggregate **)0x0) {
          iVar4 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[3])();
          local_90 = (TIntermTyped *)CONCAT44(extraout_var_03,iVar4);
        }
        else {
          this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)(*setArg.aggregate)[1].super_TIntermOperator.super_TIntermTyped.
                              super_TIntermNode.loc.name)();
          ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (this_00,(long)(int)arg._4_4_);
          iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
          local_90 = (TIntermTyped *)CONCAT44(extraout_var_02,iVar4);
        }
        local_88 = local_90;
      }
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
      pTVar1 = *(TType **)(CONCAT44(extraout_var_04,iVar4) + 8);
      iVar4 = (*(local_88->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar3 = TType::operator!=(pTVar1,(TType *)CONCAT44(extraout_var_05,iVar4));
      if (bVar3) {
        pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
        internalAggregate =
             (TVariable *)
             TIntermediate::addConversion
                       (pTVar2,EOpFunctionCall,*(TType **)(CONCAT44(extraout_var_06,iVar4) + 8),
                        local_88);
        if (internalAggregate != (TVariable *)0x0) {
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
          internalAggregate =
               (TVariable *)
               TIntermediate::addUniShapeConversion
                         (pTVar2,EOpFunctionCall,*(TType **)(CONCAT44(extraout_var_07,iVar4) + 8),
                          (TIntermTyped *)internalAggregate);
        }
        if (internalAggregate == (TVariable *)0x0) {
          iVar4 = (**(local_88->super_TIntermNode)._vptr_TIntermNode)();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,CONCAT44(extraout_var_08,iVar4),"cannot convert input argument, argument",
                     "","%d",(ulong)arg._4_4_);
        }
        else {
          addInputArgumentConversions::anon_class_24_3_eb5deb76::operator()
                    ((anon_class_24_3_eb5deb76 *)auStack_40,arg._4_4_,
                     (TIntermTyped *)internalAggregate);
        }
      }
      else {
        bVar3 = wasFlattened(this,local_88);
        if (bVar3) {
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
          pTVar1 = *(TType **)(CONCAT44(extraout_var_09,iVar4) + 8);
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
          lVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_10,iVar4) + 8) + 0x50))();
          bVar3 = shouldFlatten(this,pTVar1,(TStorageQualifier)*(undefined8 *)(lVar9 + 8) & 0x7f,
                                true);
          if (!bVar3) {
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
            s_00 = "aggShadow";
            pTVar10 = makeInternalVariable
                                (this,"aggShadow",*(TType **)(CONCAT44(extraout_var_11,iVar4) + 8));
            iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xd])();
            pTVar7 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar4) + 0x50))();
            TQualifier::makeTemporary(pTVar7);
            this_01 = (TIntermSymbol *)TIntermNode::operator_new((TIntermNode *)0x138,(size_t)s_00);
            iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xf])();
            iVar5 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[3])();
            s = TParseContextBase::getLanguage(&this->super_TParseContextBase);
            iVar6 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xc])();
            TIntermSymbol::TIntermSymbol
                      (this_01,CONCAT44(extraout_var_13,iVar4),
                       (TString *)CONCAT44(extraout_var_14,iVar5),s,
                       (TType *)CONCAT44(extraout_var_15,iVar6),(TString *)0x0);
            iVar4 = (**(local_88->super_TIntermNode)._vptr_TIntermNode)();
            (*(this_01->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])
                      (this_01,CONCAT44(extraout_var_16,iVar4));
            iVar4 = (**(local_88->super_TIntermNode)._vptr_TIntermNode)();
            pTVar11 = handleAssign(this,(TSourceLoc *)CONCAT44(extraout_var_17,iVar4),EOpAssign,
                                   (TIntermTyped *)this_01,local_88);
            iVar4 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[6])();
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (**(local_88->super_TIntermNode)._vptr_TIntermNode)();
            arg_00 = TIntermediate::growAggregate
                               (pTVar2,(TIntermNode *)CONCAT44(extraout_var_18,iVar4),
                                (TIntermNode *)this_01,(TSourceLoc *)CONCAT44(extraout_var_19,iVar5)
                               );
            (*(arg_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x31])(arg_00,0x2b);
            iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xc])();
            (*(arg_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1d])(arg_00,CONCAT44(extraout_var_20,iVar4));
            addInputArgumentConversions::anon_class_24_3_eb5deb76::operator()
                      ((anon_class_24_3_eb5deb76 *)auStack_40,arg._4_4_,(TIntermTyped *)arg_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::addInputArgumentConversions(const TFunction& function, TIntermTyped*& arguments)
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();

    // Replace a single argument with a single argument.
    const auto setArg = [&](int paramNum, TIntermTyped* arg) {
        if (function.getParamCount() == 1)
            arguments = arg;
        else {
            if (aggregate == nullptr)
                arguments = arg;
            else
                aggregate->getSequence()[paramNum] = arg;
        }
    };

    // Process each argument's conversion
    for (int param = 0; param < function.getParamCount(); ++param) {
        if (! function[param].type->getQualifier().isParamInput())
            continue;

        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1
                                   ? arguments->getAsTyped()
                                   : (aggregate ?
                                        aggregate->getSequence()[param]->getAsTyped() :
                                        arguments->getAsTyped());
        if (*function[param].type != arg->getType()) {
            // In-qualified arguments just need an extra node added above the argument to
            // convert to the correct type.
            TIntermTyped* convArg = intermediate.addConversion(EOpFunctionCall, *function[param].type, arg);
            if (convArg != nullptr)
                convArg = intermediate.addUniShapeConversion(EOpFunctionCall, *function[param].type, convArg);
            if (convArg != nullptr)
                setArg(param, convArg);
            else
                error(arg->getLoc(), "cannot convert input argument, argument", "", "%d", param);
        } else {
            if (wasFlattened(arg)) {
                // If both formal and calling arg are to be flattened, leave that to argument
                // expansion, not conversion.
                if (!shouldFlatten(*function[param].type, function[param].type->getQualifier().storage, true)) {
                    // Will make a two-level subtree.
                    // The deepest will copy member-by-member to build the structure to pass.
                    // The level above that will be a two-operand EOpComma sequence that follows the copy by the
                    // object itself.
                    TVariable* internalAggregate = makeInternalVariable("aggShadow", *function[param].type);
                    internalAggregate->getWritableType().getQualifier().makeTemporary();
                    TIntermSymbol* internalSymbolNode = new TIntermSymbol(internalAggregate->getUniqueId(),
                                                                          internalAggregate->getName(),
                                                                          getLanguage(),
                                                                          internalAggregate->getType());
                    internalSymbolNode->setLoc(arg->getLoc());
                    // This makes the deepest level, the member-wise copy
                    TIntermAggregate* assignAgg = handleAssign(arg->getLoc(), EOpAssign,
                                                               internalSymbolNode, arg)->getAsAggregate();

                    // Now, pair that with the resulting aggregate.
                    assignAgg = intermediate.growAggregate(assignAgg, internalSymbolNode, arg->getLoc());
                    assignAgg->setOperator(EOpComma);
                    assignAgg->setType(internalAggregate->getType());
                    setArg(param, assignAgg);
                }
            }
        }
    }
}